

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

golf_entity_t * golf_entity_make_copy(golf_entity_t *__return_storage_ptr__,golf_entity_t *entity)

{
  undefined8 uVar1;
  golf_entity_type_t gVar2;
  golf_geo_point_t *pgVar3;
  vec_golf_geo_point_t points;
  vec_golf_geo_face_t faces;
  golf_geo_generator_data_t generator_data;
  void *pvVar4;
  undefined4 uVar5;
  int iVar6;
  sg_buffer sVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar12;
  char *pcVar13;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar14;
  long lVar15;
  undefined8 *puVar16;
  golf_geo_t *pgVar17;
  byte bVar18;
  vec_vec2_t uvs_copy;
  vec_vec2_t uvs_copy_1;
  vec_int_t idx_copy;
  vec_golf_geo_face_t faces_copy;
  vec_golf_geo_point_t points_copy;
  golf_geo_face_t face_copy;
  golf_lightmap_section_t section;
  char *local_288;
  undefined8 uStack_280;
  char *local_278;
  char *local_268;
  undefined8 uStack_260;
  char *local_258;
  undefined4 local_24c;
  undefined8 local_248;
  int aiStack_240 [2];
  char *local_238;
  char *local_228;
  undefined8 uStack_220;
  char *local_218;
  char *local_208;
  undefined8 uStack_200;
  char *local_1f8;
  golf_script_t *local_1e8;
  undefined8 uStack_1e0;
  void *local_1d8;
  golf_entity_t *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  int iStack_1c0;
  undefined4 uStack_1bc;
  char *local_1b8;
  undefined8 local_1a8;
  char *pcStack_1a0;
  char *local_198;
  char *pcStack_190;
  undefined8 local_160;
  undefined8 uStack_158;
  char *local_150;
  int local_148;
  char *local_140;
  char *pcStack_138;
  char *local_130;
  undefined4 local_128;
  undefined8 local_124;
  undefined4 local_11c;
  undefined1 local_118 [16];
  undefined8 local_108;
  vec2 *pvStack_100;
  golf_geo_point_t *local_f8;
  char *pcStack_f0;
  uint32_t local_e8 [2];
  golf_geo_face_t *pgStack_e0;
  char *local_d8;
  char *pcStack_d0;
  char *local_c8;
  golf_model_group_t *pgStack_c0;
  int local_b8;
  char *local_b0;
  int local_a8;
  undefined8 local_94;
  undefined4 local_8c;
  
  bVar18 = 0;
  memcpy(__return_storage_ptr__,entity,0x510);
  gVar2 = entity->type;
  if ((gVar2 == WATER_ENTITY) || (gVar2 == GEO_ENTITY)) {
    paVar14 = &entity->field_4;
  }
  else if (gVar2 == MODEL_ENTITY) {
    paVar14 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
              &(entity->field_4).model.lightmap_section;
  }
  else {
    paVar14 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
  }
  gVar2 = __return_storage_ptr__->type;
  if ((gVar2 == WATER_ENTITY) || (gVar2 == GEO_ENTITY)) {
    paVar12 = &__return_storage_ptr__->field_4;
  }
  else if (gVar2 == MODEL_ENTITY) {
    paVar12 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
              &(__return_storage_ptr__->field_4).model.lightmap_section;
  }
  else {
    paVar12 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
  }
  if (paVar14 != (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0) {
    local_288 = (char *)0x0;
    uStack_280 = (char *)0x0;
    local_278 = "level";
    iVar8 = *(int *)((long)paVar14 + 0x48);
    iVar6 = vec_reserve_po2_(&local_288,(int *)&uStack_280,(int *)((long)&uStack_280 + 4),8,iVar8,
                             "level");
    if (iVar6 == 0 && 0 < (long)iVar8) {
      lVar9 = 0;
      do {
        lVar11 = (long)(int)uStack_280;
        uStack_280 = (char *)CONCAT44(uStack_280._4_4_,(int)uStack_280 + 1);
        *(vec2 *)(local_288 + lVar11 * 8) = ((vec_vec2_t *)((long)paVar14 + 0x40))->data[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar8 != lVar9);
    }
    local_198 = local_278;
    local_1a8 = (golf_script_t *)local_288;
    pcStack_1a0 = uStack_280;
    snprintf(local_118,0x40,"%s",paVar14);
    local_d8 = local_1a8->path;
    pcStack_d0 = pcStack_1a0;
    local_c8 = local_198;
    pcVar13 = local_118;
    paVar14 = paVar12;
    for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)paVar14 = *(undefined8 *)pcVar13;
      pcVar13 = pcVar13 + (ulong)bVar18 * -0x10 + 8;
      paVar14 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
                ((long)paVar14 + (ulong)bVar18 * -0x10 + 8);
    }
    local_c8 = (char *)0x0;
    pgStack_c0 = (golf_model_group_t *)0x0;
    local_d8 = (char *)0x0;
    pcStack_d0 = (char *)0x0;
    local_e8[0] = 0;
    local_e8[1] = 0;
    pgStack_e0 = (golf_geo_face_t *)0x0;
    pcStack_f0 = (char *)0x0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108._0_4_ = 1;
    local_108._4_4_ = 0;
    pvStack_100 = ((vec_vec2_t *)((long)paVar12 + 0x40))->data;
    local_f8 = (golf_geo_point_t *)((long)*(int *)((long)paVar12 + 0x48) << 3);
    sVar7 = sg_make_buffer((sg_buffer_desc *)local_118);
    ((sg_buffer *)((long)paVar12 + 0x58))->id = sVar7.id;
  }
  if (entity->type == WATER_ENTITY) {
    pgVar17 = &(entity->field_4).water.geo;
  }
  else if (entity->type == GEO_ENTITY) {
    pgVar17 = &(entity->field_4).geo.geo;
  }
  else {
    pgVar17 = (golf_geo_t *)0x0;
  }
  if (__return_storage_ptr__->type == WATER_ENTITY) {
    local_1d8 = (void *)((long)&__return_storage_ptr__->field_4 + 0x88);
  }
  else if (__return_storage_ptr__->type == GEO_ENTITY) {
    local_1d8 = (void *)((long)&__return_storage_ptr__->field_4 + 0xb0);
  }
  else {
    local_1d8 = (void *)0x0;
  }
  if (pgVar17 != (golf_geo_t *)0x0) {
    local_208 = (char *)0x0;
    uStack_200 = 0;
    local_1f8 = "geo";
    local_1d0 = __return_storage_ptr__;
    if (0 < (pgVar17->points).length) {
      lVar11 = 0xc;
      lVar9 = 0;
      do {
        pgVar3 = (pgVar17->points).data;
        uVar1 = *(undefined8 *)((long)pgVar3 + lVar11 + -8);
        local_118._8_4_ = *(undefined4 *)(&pgVar3->active + lVar11);
        local_118._0_4_ = (undefined4)uVar1;
        uVar5 = local_118._0_4_;
        local_118._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
        local_1e8._4_4_ = local_118._8_4_;
        local_1e8._0_4_ = local_118._4_4_;
        uStack_1e0 = 0;
        iVar8 = vec_expand_(&local_208,(int *)&uStack_200,(int *)((long)&uStack_200 + 4),0x10,
                            local_1f8);
        if (iVar8 == 0) {
          lVar10 = (long)(int)uStack_200;
          uStack_200 = CONCAT44(uStack_200._4_4_,(int)uStack_200 + 1);
          lVar10 = lVar10 * 0x10;
          pcVar13 = local_208 + lVar10;
          pcVar13[0] = '\x01';
          pcVar13[1] = '\0';
          pcVar13[2] = '\0';
          pcVar13[3] = '\0';
          *(undefined4 *)(local_208 + lVar10 + 4) = uVar5;
          *(golf_script_t **)(local_208 + lVar10 + 8) = local_1e8;
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar9 < (pgVar17->points).length);
    }
    local_228 = (char *)0x0;
    uStack_220 = 0;
    local_218 = "geo";
    if (0 < (pgVar17->faces).length) {
      lVar9 = 0;
      do {
        memcpy(local_118,(pgVar17->faces).data + lVar9,0x90);
        local_248 = (char *)0x0;
        aiStack_240[0] = 0;
        aiStack_240[1] = 0;
        local_238 = "face";
        lVar11 = (long)(int)local_c8;
        iVar8 = vec_reserve_po2_((char **)&local_248,aiStack_240,aiStack_240 + 1,4,(int)local_c8,
                                 "face");
        if (iVar8 == 0 && 0 < lVar11) {
          lVar10 = 0;
          do {
            lVar15 = (long)aiStack_240[0];
            aiStack_240[0] = aiStack_240[0] + 1;
            *(undefined4 *)(local_248 + lVar15 * 4) = *(undefined4 *)(pcStack_d0 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar11 != lVar10);
        }
        local_268 = (char *)0x0;
        uStack_260 = (char *)0x0;
        local_258 = "face";
        lVar11 = (long)local_a8;
        iVar6 = vec_reserve_po2_(&local_268,(int *)&uStack_260,(int *)((long)&uStack_260 + 4),8,
                                 local_a8,"face");
        iVar8 = local_b8;
        if (iVar6 == 0 && 0 < lVar11) {
          lVar10 = 0;
          do {
            lVar15 = (long)(int)uStack_260;
            uStack_260 = (char *)CONCAT44(uStack_260._4_4_,(int)uStack_260 + 1);
            *(undefined8 *)(local_268 + lVar15 * 8) = *(undefined8 *)(local_b0 + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar11 != lVar10);
        }
        local_1e8 = (golf_script_t *)local_94;
        local_24c = local_8c;
        local_278 = local_258;
        local_288 = local_268;
        uStack_280 = uStack_260;
        local_1c8 = (undefined4)local_248;
        uStack_1c4 = local_248._4_4_;
        iStack_1c0 = aiStack_240[0];
        uStack_1bc = aiStack_240[1];
        local_1b8 = local_238;
        local_1a8 = (golf_script_t *)CONCAT71(local_1a8._1_7_,1);
        snprintf((char *)((long)&local_1a8 + 1),0x40,"%s",local_118 + 1);
        local_150 = local_1b8;
        local_160 = CONCAT44(uStack_1c4,local_1c8);
        uStack_158 = CONCAT44(uStack_1bc,iStack_1c0);
        local_130 = local_278;
        local_140 = local_288;
        pcStack_138 = uStack_280;
        local_148 = iVar8;
        local_128 = 0;
        local_124 = local_1e8;
        local_11c = local_24c;
        iVar8 = vec_expand_(&local_228,(int *)&uStack_220,(int *)((long)&uStack_220 + 4),0x90,
                            local_218);
        if (iVar8 == 0) {
          lVar11 = (long)(int)uStack_220;
          uStack_220 = CONCAT44(uStack_220._4_4_,(int)uStack_220 + 1);
          memcpy(local_228 + lVar11 * 0x90,&local_1a8,0x90);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (pgVar17->faces).length);
    }
    local_1e8 = (pgVar17->generator_data).script;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108 = "geo";
    if (0 < (pgVar17->generator_data).args.length) {
      lVar9 = 0;
      lVar11 = 0;
      do {
        iVar8 = vec_expand_((char **)local_118,(int *)(local_118 + 8),(int *)(local_118 + 0xc),0x58,
                            local_108);
        if (iVar8 == 0) {
          lVar10 = (long)(int)local_118._8_4_;
          local_118._8_4_ = local_118._8_4_ + 1;
          pcVar13 = ((pgVar17->generator_data).args.data)->name + lVar9;
          puVar16 = (undefined8 *)(lVar10 * 0x58 + CONCAT44(local_118._4_4_,local_118._0_4_));
          for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar16 = *(undefined8 *)pcVar13;
            pcVar13 = pcVar13 + ((ulong)bVar18 * -2 + 1) * 8;
            puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
          }
        }
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x58;
      } while (lVar11 < (pgVar17->generator_data).args.length);
    }
    pcStack_190 = local_108;
    pcStack_1a0 = (char *)CONCAT44(local_118._4_4_,local_118._0_4_);
    local_198 = (char *)CONCAT44(local_118._12_4_,local_118._8_4_);
    local_1a8 = local_1e8;
    points.length = (int)uStack_200;
    points.capacity = uStack_200._4_4_;
    points.data = (golf_geo_point_t *)local_208;
    points.alloc_category = local_1f8;
    faces.length = (int)uStack_220;
    faces.capacity = uStack_220._4_4_;
    faces.data = (golf_geo_face_t *)local_228;
    faces.alloc_category = local_218;
    generator_data.args.data = (golf_geo_generator_data_arg_t *)pcStack_1a0;
    generator_data.script = local_1e8;
    generator_data.args.length = local_118._8_4_;
    generator_data.args.capacity = local_118._12_4_;
    generator_data.args.alloc_category = local_108;
    golf_geo((golf_geo_t *)local_118,points,faces,generator_data,pgVar17->is_water);
    pvVar4 = local_1d8;
    memcpy(local_1d8,(golf_geo_t *)local_118,0xe8);
    *(undefined1 *)((long)pvVar4 + 0x51) = 1;
    golf_model_dynamic_finalize((golf_model_t *)((long)pvVar4 + 0x58));
    __return_storage_ptr__ = local_1d0;
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_make_copy(golf_entity_t *entity) {
    golf_entity_t entity_copy = *entity;

    golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
    golf_lightmap_section_t *lightmap_section_copy = golf_entity_get_lightmap_section(&entity_copy);
    if (lightmap_section) {
        vec_vec2_t uvs_copy;
        vec_init(&uvs_copy, "level");
        vec_pusharr(&uvs_copy, lightmap_section->uvs.data, lightmap_section->uvs.length);
        *lightmap_section_copy = golf_lightmap_section(lightmap_section->lightmap_name, uvs_copy);
        golf_lightmap_section_finalize(lightmap_section_copy);
    }

    golf_geo_t *geo = golf_entity_get_geo(entity);
    golf_geo_t *geo_copy = golf_entity_get_geo(&entity_copy);
    if (geo) {
        vec_golf_geo_point_t points_copy;
        vec_init(&points_copy, "geo");
        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t point = geo->points.data[i];
            golf_geo_point_t point_copy = golf_geo_point(point.position);
            vec_push(&points_copy, point_copy);
        }

        vec_golf_geo_face_t faces_copy;
        vec_init(&faces_copy, "geo");
        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];

            vec_int_t idx_copy;
            vec_init(&idx_copy, "face");
            vec_pusharr(&idx_copy, face.idx.data, face.idx.length);

            vec_vec2_t uvs_copy;
            vec_init(&uvs_copy, "face");
            vec_pusharr(&uvs_copy, face.uvs.data, face.uvs.length);

            golf_geo_face_t face_copy = golf_geo_face(face.material_name, idx_copy, face.uv_gen_type, uvs_copy, face.water_dir);
            vec_push(&faces_copy, face_copy);
        }

        golf_geo_generator_data_t generator_data_copy;
        {
            golf_script_t *script = geo->generator_data.script;
            vec_golf_geo_generator_data_arg_t args;
            vec_init(&args, "geo");
            for (int i = 0; i < geo->generator_data.args.length; i++) {
                vec_push(&args, geo->generator_data.args.data[i]);
            }
            generator_data_copy = golf_geo_generator_data(script, args);
        }

        *geo_copy = golf_geo(points_copy, faces_copy, generator_data_copy, geo->is_water);
        golf_geo_finalize(geo_copy);
    }

    return entity_copy;
}